

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O1

Amount cfd::core::operator/(Amount *amount,int64_t value)

{
  long lVar1;
  double dVar2;
  Amount AVar3;
  
  lVar1 = amount->amount_;
  Amount::CheckValidAmount(0x446c9e);
  Amount::CheckValidAmount(0x446ca6);
  dVar2 = round((double)lVar1 / (double)value);
  Amount::CheckValidAmount(0x446cc6);
  AVar3._8_8_ = 0;
  AVar3.amount_ = (long)dVar2;
  return AVar3;
}

Assistant:

Amount operator/(const Amount& amount, const int64_t value) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) /= value;
}